

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O0

void per_scan_setup(j_decompress_ptr cinfo)

{
  long lVar1;
  long *in_RDI;
  jpeg_component_info *compptr;
  int tmp;
  int mcublks;
  int ci;
  uint local_14;
  int local_10;
  int local_c;
  
  if ((int)in_RDI[0x36] == 1) {
    lVar1 = in_RDI[0x37];
    *(undefined4 *)(in_RDI + 0x3b) = *(undefined4 *)(lVar1 + 0x1c);
    *(undefined4 *)((long)in_RDI + 0x1dc) = *(undefined4 *)(lVar1 + 0x20);
    *(undefined4 *)(lVar1 + 0x34) = 1;
    *(undefined4 *)(lVar1 + 0x38) = 1;
    *(undefined4 *)(lVar1 + 0x3c) = 1;
    *(undefined4 *)(lVar1 + 0x40) = *(undefined4 *)(lVar1 + 0x24);
    *(undefined4 *)(lVar1 + 0x44) = 1;
    local_14 = *(uint *)(lVar1 + 0x20) % *(uint *)(lVar1 + 0xc);
    if (local_14 == 0) {
      local_14 = *(uint *)(lVar1 + 0xc);
    }
    *(uint *)(lVar1 + 0x48) = local_14;
    *(undefined4 *)(in_RDI + 0x3c) = 1;
    *(undefined4 *)((long)in_RDI + 0x1e4) = 0;
  }
  else {
    if (((int)in_RDI[0x36] < 1) || (4 < (int)in_RDI[0x36])) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1a;
      *(int *)(*in_RDI + 0x2c) = (int)in_RDI[0x36];
      *(undefined4 *)(*in_RDI + 0x30) = 4;
      (**(code **)*in_RDI)(in_RDI);
    }
    lVar1 = jdiv_round_up((ulong)*(uint *)(in_RDI + 6),(long)((int)in_RDI[0x33] << 3));
    *(int *)(in_RDI + 0x3b) = (int)lVar1;
    lVar1 = jdiv_round_up((ulong)*(uint *)((long)in_RDI + 0x34),
                          (long)(*(int *)((long)in_RDI + 0x19c) << 3));
    *(int *)((long)in_RDI + 0x1dc) = (int)lVar1;
    *(undefined4 *)(in_RDI + 0x3c) = 0;
    for (local_c = 0; local_c < (int)in_RDI[0x36]; local_c = local_c + 1) {
      lVar1 = in_RDI[(long)local_c + 0x37];
      *(undefined4 *)(lVar1 + 0x34) = *(undefined4 *)(lVar1 + 8);
      *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)(lVar1 + 0xc);
      *(int *)(lVar1 + 0x3c) = *(int *)(lVar1 + 0x34) * *(int *)(lVar1 + 0x38);
      *(int *)(lVar1 + 0x40) = *(int *)(lVar1 + 0x34) * *(int *)(lVar1 + 0x24);
      local_14 = *(uint *)(lVar1 + 0x1c) % *(uint *)(lVar1 + 0x34);
      if (local_14 == 0) {
        local_14 = *(uint *)(lVar1 + 0x34);
      }
      *(uint *)(lVar1 + 0x44) = local_14;
      local_14 = *(uint *)(lVar1 + 0x20) % *(uint *)(lVar1 + 0x38);
      if (local_14 == 0) {
        local_14 = *(uint *)(lVar1 + 0x38);
      }
      *(uint *)(lVar1 + 0x48) = local_14;
      local_10 = *(int *)(lVar1 + 0x3c);
      if (10 < (int)in_RDI[0x3c] + local_10) {
        *(undefined4 *)(*in_RDI + 0x28) = 0xd;
        (**(code **)*in_RDI)(in_RDI);
      }
      while (0 < local_10) {
        lVar1 = in_RDI[0x3c];
        *(int *)(in_RDI + 0x3c) = (int)lVar1 + 1;
        *(int *)((long)in_RDI + (long)(int)lVar1 * 4 + 0x1e4) = local_c;
        local_10 = local_10 + -1;
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
per_scan_setup(j_decompress_ptr cinfo)
/* Do computations that are needed before processing a JPEG scan */
/* cinfo->comps_in_scan and cinfo->cur_comp_info[] were set from SOS marker */
{
  int ci, mcublks, tmp;
  jpeg_component_info *compptr;

  if (cinfo->comps_in_scan == 1) {

    /* Noninterleaved (single-component) scan */
    compptr = cinfo->cur_comp_info[0];

    /* Overall image size in MCUs */
    cinfo->MCUs_per_row = compptr->width_in_blocks;
    cinfo->MCU_rows_in_scan = compptr->height_in_blocks;

    /* For noninterleaved scan, always one block per MCU */
    compptr->MCU_width = 1;
    compptr->MCU_height = 1;
    compptr->MCU_blocks = 1;
    compptr->MCU_sample_width = compptr->_DCT_scaled_size;
    compptr->last_col_width = 1;
    /* For noninterleaved scans, it is convenient to define last_row_height
     * as the number of block rows present in the last iMCU row.
     */
    tmp = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
    if (tmp == 0) tmp = compptr->v_samp_factor;
    compptr->last_row_height = tmp;

    /* Prepare array describing MCU composition */
    cinfo->blocks_in_MCU = 1;
    cinfo->MCU_membership[0] = 0;

  } else {

    /* Interleaved (multi-component) scan */
    if (cinfo->comps_in_scan <= 0 || cinfo->comps_in_scan > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->comps_in_scan,
               MAX_COMPS_IN_SCAN);

    /* Overall image size in MCUs */
    cinfo->MCUs_per_row = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_width,
                    (long)(cinfo->max_h_samp_factor * DCTSIZE));
    cinfo->MCU_rows_in_scan = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_height,
                    (long)(cinfo->max_v_samp_factor * DCTSIZE));

    cinfo->blocks_in_MCU = 0;

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Sampling factors give # of blocks of component in each MCU */
      compptr->MCU_width = compptr->h_samp_factor;
      compptr->MCU_height = compptr->v_samp_factor;
      compptr->MCU_blocks = compptr->MCU_width * compptr->MCU_height;
      compptr->MCU_sample_width = compptr->MCU_width *
                                  compptr->_DCT_scaled_size;
      /* Figure number of non-dummy blocks in last MCU column & row */
      tmp = (int)(compptr->width_in_blocks % compptr->MCU_width);
      if (tmp == 0) tmp = compptr->MCU_width;
      compptr->last_col_width = tmp;
      tmp = (int)(compptr->height_in_blocks % compptr->MCU_height);
      if (tmp == 0) tmp = compptr->MCU_height;
      compptr->last_row_height = tmp;
      /* Prepare array describing MCU composition */
      mcublks = compptr->MCU_blocks;
      if (cinfo->blocks_in_MCU + mcublks > D_MAX_BLOCKS_IN_MCU)
        ERREXIT(cinfo, JERR_BAD_MCU_SIZE);
      while (mcublks-- > 0) {
        cinfo->MCU_membership[cinfo->blocks_in_MCU++] = ci;
      }
    }

  }
}